

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::IndianCalendar::handleGetMonthLength(IndianCalendar *this,int32_t eyear,int32_t month)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int32_t local_c;
  
  local_c = month;
  if (0xb < (uint)month) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&local_c);
    eyear = eyear + iVar1;
  }
  uVar3 = eyear + 0x4e;
  if ((uVar3 & 3) == 0) {
    uVar2 = uVar3 * -0x3d70a3d7 + 0x51eb850;
    bVar4 = true;
    if ((uVar2 >> 2 | uVar3 * 0x40000000) < 0x28f5c29) {
      bVar4 = (uVar2 >> 4 | uVar3 * -0x70000000) < 0xa3d70b;
    }
  }
  else {
    bVar4 = false;
  }
  return (byte)(local_c - 1U < 5 | local_c == 0 & bVar4) | 0x1e;
}

Assistant:

int32_t IndianCalendar::handleGetMonthLength(int32_t eyear, int32_t month) const {
   if (month < 0 || month > 11) {
      eyear += ClockMath::floorDivide(month, 12, month);
   }

   if (isGregorianLeap(eyear + INDIAN_ERA_START) && month == 0) {
       return 31;
   }

   if (month >= 1 && month <= 5) {
       return 31;
   }

   return 30;
}